

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

void helics::BrokerFactory::addAssociatedBrokerType(string_view name,CoreType type)

{
  undefined4 in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string sname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39 [13];
  CoreType in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)
                    CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (allocator<char> *)in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator(local_39);
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  addExtraTypes(in_stack_ffffffffffffffb0,(CoreType)((ulong)local_39 >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void addAssociatedBrokerType(std::string_view name, CoreType type)
{
    const std::string sname{name};
    searchableBrokers.addType(sname, type);
    addExtraTypes(sname, type);
}